

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O0

void LDSketch_copy(LDSketch_t *tbl,LDSketch_t *ret_tbl)

{
  dyn_tbl_t *in_RSI;
  long in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar1;
  
  if (in_RSI == (dyn_tbl_t *)0x0) {
    fprintf(_stderr,"ERR: ret_tbl in LDSketch_copy() is NULL\n");
  }
  else {
    for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 8) * *(int *)(in_RDI + 0xc); iVar1 = iVar1 + 1) {
      dyn_tbl_copy(in_RSI,(dyn_tbl_t *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
    }
  }
  return;
}

Assistant:

void LDSketch_copy(LDSketch_t* tbl, LDSketch_t* ret_tbl) {
	if (ret_tbl == NULL) {
		fprintf(stderr, "ERR: ret_tbl in LDSketch_copy() is NULL\n");
		return;
	}

	// memcpy(ret_tbl->T, tbl->T, tbl->size * sizeof(long long));
	for (int i = 0; i < tbl->h * tbl->w; ++i) {
		dyn_tbl_copy(tbl->tbl[i], ret_tbl->tbl[i]);
	}
	// ret_tbl->total = tbl->total;
}